

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O0

void __thiscall HdmiCecAnalyzerResults::GenEOMBubble(HdmiCecAnalyzerResults *this,Frame *frame)

{
  char *local_138;
  char *local_120;
  char *local_108;
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [39];
  byte local_19;
  Frame *pFStack_18;
  bool eom;
  Frame *frame_local;
  HdmiCecAnalyzerResults *this_local;
  
  local_19 = *(long *)(frame + 0x10) != 0;
  pFStack_18 = frame;
  frame_local = (Frame *)this;
  if ((this->mTabular & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"E",&local_41);
    AddResult(this,(string *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if ((local_19 & 1) == 0) {
      local_108 = "E=0";
    }
    else {
      local_108 = "E=1";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,local_108,&local_79);
    AddResult(this,(string *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    if ((local_19 & 1) == 0) {
      local_120 = "EOM=0";
    }
    else {
      local_120 = "EOM=1";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,local_120,&local_a1);
    AddResult(this,(string *)local_a0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  if ((local_19 & 1) == 0) {
    local_138 = "A=0";
  }
  else {
    local_138 = "A=1";
  }
  local_138 = local_138 + 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,local_138,&local_e9);
  std::operator+((char *)local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "End of Message = ");
  AddResult(this,local_c8);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenEOMBubble( const Frame& frame )
{
    bool eom = frame.mData1;

    if( !mTabular )
    {
        AddResult( "E" );
        AddResult( eom ? "E=1" : "E=0" );
        AddResult( eom ? "EOM=1" : "EOM=0" );
    }
    AddResult( "End of Message = " + std::string( eom ? "1" : "0" ) );
}